

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_2;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *args_4;
  TypedefDeclarationSyntax *pTVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  args_4 = deepClone<slang::syntax::VariableDimensionSyntax>
                     ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)(__fn + 0x78),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0xb0),(BumpAllocator *)__child_stack);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,(DataTypeSyntax *)args_2,
                      &local_60,args_4,&local_50);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TypedefDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TypedefDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.typedefKeyword.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        node.name.deepClone(alloc),
        *deepClone(node.dimensions, alloc),
        node.semi.deepClone(alloc)
    );
}